

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O1

bool __thiscall Hpipe::Cond::never_checked(Cond *this,Cond *not_in)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (not_in != (Cond *)0x0) {
    uVar2 = 0;
    bVar3 = false;
    while( true ) {
      if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) &&
         (((this->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] & 1L << ((byte)uVar2 & 0x3f)) != 0))
      break;
      bVar3 = 0xfe < uVar2;
      uVar2 = uVar2 + 1;
      if (uVar2 == 0x100) {
        return true;
      }
    }
    if (bVar3) {
      return true;
    }
    return false;
  }
  if (((this->p).super__Base_bitset<4UL>._M_w[0] & 1) == 0) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (uVar2 == 0xfe) {
        return true;
      }
      uVar1 = uVar2 + 2;
      uVar2 = uVar2 + 1;
    } while (((this->p).super__Base_bitset<4UL>._M_w[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0);
    if (0xfe < uVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Cond::never_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and p[ i ] )
                return false;
    } else {
        for( int i = 0; i < p_size; ++i )
            if ( p[ i ] )
                return false;
    }
    return true;
}